

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int byte_size_before_serialization;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  uint8 *puVar5;
  long lVar6;
  
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  if (output->buffer_size_ < byte_size_before_serialization) {
    puVar5 = (uint8 *)0x0;
  }
  else {
    puVar5 = output->buffer_;
    output->buffer_ = puVar5 + byte_size_before_serialization;
    output->buffer_size_ = output->buffer_size_ - byte_size_before_serialization;
  }
  if (puVar5 == (uint8 *)0x0) {
    iVar2 = output->buffer_size_;
    iVar3 = output->total_bytes_;
    (*this->_vptr_MessageLite[10])(this,output);
    bVar1 = output->had_error_;
    if ((bVar1 == false) &&
       (iVar2 = (output->total_bytes_ - output->buffer_size_) + (iVar2 - iVar3),
       iVar2 != byte_size_before_serialization)) {
      iVar3 = (*this->_vptr_MessageLite[9])(this);
      anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar3,iVar2);
    }
    bVar4 = bVar1 ^ 1;
  }
  else {
    iVar2 = (*this->_vptr_MessageLite[0xb])(this,puVar5);
    lVar6 = CONCAT44(extraout_var,iVar2) - (long)puVar5;
    bVar4 = 1;
    if (lVar6 != byte_size_before_serialization) {
      iVar2 = (*this->_vptr_MessageLite[9])(this);
      anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar2,(int)lVar6);
    }
  }
  return (bool)bVar4;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const int size = ByteSize();  // Force size to be cached.
  uint8* buffer = output->GetDirectBufferForNBytesAndAdvance(size);
  if (buffer != NULL) {
    uint8* end = SerializeWithCachedSizesToArray(buffer);
    if (end - buffer != size) {
      ByteSizeConsistencyError(size, ByteSize(), end - buffer);
    }
    return true;
  } else {
    int original_byte_count = output->ByteCount();
    SerializeWithCachedSizes(output);
    if (output->HadError()) {
      return false;
    }
    int final_byte_count = output->ByteCount();

    if (final_byte_count - original_byte_count != size) {
      ByteSizeConsistencyError(size, ByteSize(),
                               final_byte_count - original_byte_count);
    }

    return true;
  }
}